

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.cpp
# Opt level: O1

Float pbrt::FresnelMoment2(Float eta)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar5 [64];
  float fVar6;
  
  auVar5._4_60_ = in_register_00001204;
  auVar5._0_4_ = eta;
  fVar1 = eta * eta;
  fVar2 = fVar1 * eta;
  fVar3 = fVar2 * eta;
  if (eta < 1.0) {
    auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf5f9db2),0),auVar5._0_16_,ZEXT416(0x3e8d6239));
    auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar1),ZEXT416(0x3f8f7564));
    auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar2),ZEXT416(0xbf26a4a9));
    auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar3),ZEXT416(0x3da1719f));
    auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)(fVar3 * eta)),ZEXT416(0x3d4710cb));
    return auVar4._0_4_;
  }
  fVar6 = 1.0 / eta;
  auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x42353c1c),0),ZEXT416((uint)(fVar6 * fVar6 * fVar6)),
                           ZEXT416(0xc408c21d));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)(fVar6 * fVar6)),ZEXT416(0xc35ab99a));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar6),ZEXT416(0x43e56be7));
  auVar4 = vfmadd231ss_fma(auVar4,auVar5._0_16_,ZEXT416(0x43ca474c));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar1),ZEXT416(0xc33d84dd));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar2),ZEXT416(0x425bbb16));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar3),ZEXT416(0xc11018b3));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)(fVar3 * eta)),ZEXT416(0x3f23b107));
  return auVar4._0_4_;
}

Assistant:

Float FresnelMoment2(Float eta) {
    Float eta2 = eta * eta, eta3 = eta2 * eta, eta4 = eta3 * eta, eta5 = eta4 * eta;
    if (eta < 1) {
        return 0.27614f - 0.87350f * eta + 1.12077f * eta2 - 0.65095f * eta3 +
               0.07883f * eta4 + 0.04860f * eta5;
    } else {
        Float r_eta = 1 / eta, r_eta2 = r_eta * r_eta, r_eta3 = r_eta2 * r_eta;
        return -547.033f + 45.3087f * r_eta3 - 218.725f * r_eta2 + 458.843f * r_eta +
               404.557f * eta - 189.519f * eta2 + 54.9327f * eta3 - 9.00603f * eta4 +
               0.63942f * eta5;
    }
}